

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O1

int Cgt_ManCheckGateComplete
              (Aig_Man_t *pAig,Vec_Vec_t *vGatesAll,Aig_Obj_t *pGate,Vec_Ptr_t *vFanout)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  
  if (0 < (long)vFanout->nSize) {
    lVar3 = 0;
    do {
      piVar1 = (int *)vFanout->pArray[lVar3];
      if ((((uint)*(undefined8 *)(piVar1 + 6) & 7) == 3) && (*piVar1 < pAig->nTruePos)) {
        return 0;
      }
      if (0xfffffffd < ((uint)*(undefined8 *)(piVar1 + 6) & 7) - 7) {
        __assert_fail("!Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
      }
      uVar4 = *piVar1 - pAig->nTruePos;
      if (((int)uVar4 < 0) || (vGatesAll->nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      lVar5 = (long)*(int *)((long)vGatesAll->pArray[uVar4] + 4);
      if (lVar5 < 1) {
        return 0;
      }
      lVar2 = 0;
      while (*(Aig_Obj_t **)(*(long *)((long)vGatesAll->pArray[uVar4] + 8) + lVar2 * 8) != pGate) {
        lVar2 = lVar2 + 1;
        if (lVar5 == lVar2) {
          return 0;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != vFanout->nSize);
  }
  return 1;
}

Assistant:

int Cgt_ManCheckGateComplete( Aig_Man_t * pAig, Vec_Vec_t * vGatesAll, Aig_Obj_t * pGate, Vec_Ptr_t * vFanout )
{
    Vec_Ptr_t * vGates;
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vFanout, pObj, i )
    {
        if ( Saig_ObjIsPo(pAig, pObj) )
            return 0;
        vGates = Vec_VecEntry( vGatesAll, Aig_ObjCioId(pObj) - Saig_ManPoNum(pAig) );
        if ( Vec_PtrFind( vGates, pGate ) == -1 )
            return 0;            
    }
    return 1;
}